

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetCommandListAppendMetricStreamerMarker
          (zet_command_list_handle_t hCommandList,zet_metric_streamer_handle_t hMetricStreamer,
          uint32_t value)

{
  zet_pfnCommandListAppendMetricStreamerMarker_t pfnAppendMetricStreamerMarker;
  ze_result_t result;
  uint32_t value_local;
  zet_metric_streamer_handle_t hMetricStreamer_local;
  zet_command_list_handle_t hCommandList_local;
  
  pfnAppendMetricStreamerMarker._0_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c828 != (code *)0x0) {
    pfnAppendMetricStreamerMarker._0_4_ = (*DAT_0011c828)(hCommandList,hMetricStreamer,value);
  }
  return (ze_result_t)pfnAppendMetricStreamerMarker;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetCommandListAppendMetricStreamerMarker(
        zet_command_list_handle_t hCommandList,         ///< [in] handle of the command list
        zet_metric_streamer_handle_t hMetricStreamer,   ///< [in] handle of the metric streamer
        uint32_t value                                  ///< [in] streamer marker value
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAppendMetricStreamerMarker = context.zetDdiTable.CommandList.pfnAppendMetricStreamerMarker;
        if( nullptr != pfnAppendMetricStreamerMarker )
        {
            result = pfnAppendMetricStreamerMarker( hCommandList, hMetricStreamer, value );
        }
        else
        {
            // generic implementation
        }

        return result;
    }